

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_Erase::_Run(_Test_Erase *this)

{
  int local_1c4;
  unsigned_long local_1c0;
  Tester local_1b8;
  
  CacheTest::Erase(&this->super_CacheTest,200);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,0x5c);
  local_1c4 = 0;
  local_1c0 = (long)(this->super_CacheTest).deleted_keys_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish -
              (long)(this->super_CacheTest).deleted_keys_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start >> 2;
  test::Tester::IsEq<int,unsigned_long>(&local_1b8,&local_1c4,&local_1c0);
  test::Tester::~Tester(&local_1b8);
  CacheTest::Insert(&this->super_CacheTest,100,0x65,1);
  CacheTest::Insert(&this->super_CacheTest,200,0xc9,1);
  CacheTest::Erase(&this->super_CacheTest,100);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,0x61);
  local_1c0._0_4_ = 0xffffffff;
  local_1c4 = CacheTest::Lookup(&this->super_CacheTest,100);
  test::Tester::IsEq<int,int>(&local_1b8,(int *)&local_1c0,&local_1c4);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,0x62);
  local_1c0 = CONCAT44(local_1c0._4_4_,0xc9);
  local_1c4 = CacheTest::Lookup(&this->super_CacheTest,200);
  test::Tester::IsEq<int,int>(&local_1b8,(int *)&local_1c0,&local_1c4);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,99);
  local_1c4 = 1;
  local_1c0 = (long)(this->super_CacheTest).deleted_keys_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish -
              (long)(this->super_CacheTest).deleted_keys_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start >> 2;
  test::Tester::IsEq<int,unsigned_long>(&local_1b8,&local_1c4,&local_1c0);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,100);
  local_1c0._0_4_ = 100;
  test::Tester::IsEq<int,int>
            (&local_1b8,(int *)&local_1c0,
             (this->super_CacheTest).deleted_keys_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,0x65);
  local_1c0._0_4_ = 0x65;
  test::Tester::IsEq<int,int>
            (&local_1b8,(int *)&local_1c0,
             (this->super_CacheTest).deleted_values_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start);
  test::Tester::~Tester(&local_1b8);
  CacheTest::Erase(&this->super_CacheTest,100);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,0x68);
  local_1c0._0_4_ = 0xffffffff;
  local_1c4 = CacheTest::Lookup(&this->super_CacheTest,100);
  test::Tester::IsEq<int,int>(&local_1b8,(int *)&local_1c0,&local_1c4);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,0x69);
  local_1c0 = CONCAT44(local_1c0._4_4_,0xc9);
  local_1c4 = CacheTest::Lookup(&this->super_CacheTest,200);
  test::Tester::IsEq<int,int>(&local_1b8,(int *)&local_1c0,&local_1c4);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
             ,0x6a);
  local_1c4 = 1;
  local_1c0 = (long)(this->super_CacheTest).deleted_keys_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish -
              (long)(this->super_CacheTest).deleted_keys_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start >> 2;
  test::Tester::IsEq<int,unsigned_long>(&local_1b8,&local_1c4,&local_1c0);
  test::Tester::~Tester(&local_1b8);
  return;
}

Assistant:

TEST(CacheTest, Erase) {
  Erase(200);
  ASSERT_EQ(0, deleted_keys_.size());

  Insert(100, 101);
  Insert(200, 201);
  Erase(100);
  ASSERT_EQ(-1, Lookup(100));
  ASSERT_EQ(201, Lookup(200));
  ASSERT_EQ(1, deleted_keys_.size());
  ASSERT_EQ(100, deleted_keys_[0]);
  ASSERT_EQ(101, deleted_values_[0]);

  Erase(100);
  ASSERT_EQ(-1, Lookup(100));
  ASSERT_EQ(201, Lookup(200));
  ASSERT_EQ(1, deleted_keys_.size());
}